

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::ISODayOfWeekOperator>>
               (date_t *ldata,long *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  date_t dVar1;
  sel_t *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  int32_t iVar8;
  ulong uVar9;
  long lVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  idx_t idx_in_entry;
  ulong uVar13;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  idx_t local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  date_t *local_40;
  long *local_38;
  
  local_40 = ldata;
  local_38 = result_data;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = sel_vector->sel_vector;
      uVar13 = 0;
      do {
        uVar9 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar2[uVar13];
        }
        dVar1.days = local_40[uVar9].days;
        bVar7 = Value::IsFinite<duckdb::date_t>(dVar1);
        if (bVar7) {
          iVar8 = Date::ExtractISODayOfTheWeek(dVar1);
          lVar10 = (long)iVar8;
        }
        else {
          _Var12._M_head_impl =
               (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_50 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_50);
            p_Var6 = p_Stack_60;
            peVar5 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).
                                  validity_data);
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var12._M_head_impl;
          }
          bVar4 = (byte)uVar13 & 0x3f;
          _Var12._M_head_impl[uVar13 >> 6] =
               _Var12._M_head_impl[uVar13 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          lVar10 = 0;
        }
        local_38[uVar13] = lVar10;
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
    }
  }
  else if (count != 0) {
    psVar2 = sel_vector->sel_vector;
    local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar13 = 0;
    do {
      uVar9 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar13];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar9 >> 6] >>
           (uVar9 & 0x3f) & 1) == 0) {
        _Var12._M_head_impl =
             (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var12._M_head_impl == (unsigned_long *)0x0) {
          local_50 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68,&local_50);
          p_Var6 = p_Stack_60;
          peVar5 = local_68;
          local_68 = (element_type *)0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
             p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          _Var12._M_head_impl =
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var12._M_head_impl;
        }
        bVar4 = (byte)uVar13 & 0x3f;
        _Var12._M_head_impl[uVar13 >> 6] =
             _Var12._M_head_impl[uVar13 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
      }
      else {
        dVar1.days = local_40[uVar9].days;
        bVar7 = Value::IsFinite<duckdb::date_t>(dVar1);
        if (bVar7) {
          iVar8 = Date::ExtractISODayOfTheWeek(dVar1);
          lVar10 = (long)iVar8;
        }
        else {
          _Var12._M_head_impl =
               (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_50 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_50);
            p_Var6 = p_Stack_60;
            peVar5 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_48);
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var12._M_head_impl;
          }
          bVar4 = (byte)uVar13 & 0x3f;
          _Var12._M_head_impl[uVar13 >> 6] =
               _Var12._M_head_impl[uVar13 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          lVar10 = 0;
        }
        local_38[uVar13] = lVar10;
      }
      uVar13 = uVar13 + 1;
    } while (count != uVar13);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}